

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O2

char_class charclass(uchar c)

{
  char_class cVar1;
  
  if ((byte)(c + 0xbf) < 0x1a) {
    cVar1 = CCLASS_UPPER;
  }
  else {
    if (0x19 < (byte)(c + 0x9f)) {
      return (uint)((byte)(c - 0x30) < 10);
    }
    cVar1 = CCLASS_LOWER;
  }
  return cVar1;
}

Assistant:

static char_class charclass(unsigned char c)
{
  if(ISUPPER(c))
    return CCLASS_UPPER;
  if(ISLOWER(c))
    return CCLASS_LOWER;
  if(ISDIGIT(c))
    return CCLASS_DIGIT;
  return CCLASS_OTHER;
}